

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementCableANCF::ComputeNF
          (ChElementCableANCF *this,double U,ChVectorDynamic<> *Qi,double *detJ,ChVectorDynamic<> *F
          ,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double *pdVar2;
  char *__function;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ShapeVector N;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1b]
  )((U + 1.0) * 0.5);
  *detJ = (this->super_ChElementBeam).length * 0.5;
  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3) {
LAB_00693420:
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    if (2 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar3 = 3;
      if (((ulong)pdVar2 & 7) == 0) {
        uVar4 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar4 < 3) {
          uVar3 = (ulong)uVar4;
        }
        if (uVar4 != 0) goto LAB_0069327c;
        uVar3 = 0;
LAB_00693299:
        do {
          pdVar2[uVar3] = local_80 * pdVar1[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 != 3);
      }
      else {
LAB_0069327c:
        uVar5 = 0;
        do {
          pdVar2[uVar5] = local_80 * pdVar1[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        if ((int)uVar3 != 3) goto LAB_00693299;
      }
      if (5 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        uVar3 = 3;
        pdVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 3;
        if (((ulong)pdVar2 & 7) == 0) {
          uVar4 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
          if ((ulong)uVar4 < 3) {
            uVar3 = (ulong)uVar4;
          }
          if (uVar4 != 0) goto LAB_006932e4;
          uVar3 = 0;
LAB_00693301:
          do {
            pdVar2[uVar3] = local_78 * pdVar1[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar3 != 3);
        }
        else {
LAB_006932e4:
          uVar5 = 0;
          do {
            pdVar2[uVar5] = local_78 * pdVar1[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
          if ((int)uVar3 != 3) goto LAB_00693301;
        }
        if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3
           ) goto LAB_00693420;
        if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
            9) goto LAB_00693409;
        pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        uVar3 = 3;
        pdVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 6;
        if (((ulong)pdVar2 & 7) == 0) {
          uVar4 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
          if ((ulong)uVar4 < 3) {
            uVar3 = (ulong)uVar4;
          }
          if (uVar4 != 0) goto LAB_0069335a;
          uVar3 = 0;
LAB_00693377:
          do {
            pdVar2[uVar3] = local_70 * pdVar1[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar3 != 3);
        }
        else {
LAB_0069335a:
          uVar5 = 0;
          do {
            pdVar2[uVar5] = local_70 * pdVar1[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
          if ((int)uVar3 != 3) goto LAB_00693377;
        }
        if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3
           ) goto LAB_00693420;
        if (0xb < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
          pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          uVar3 = 3;
          pdVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + 9;
          if (((ulong)pdVar2 & 7) == 0) {
            uVar4 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
            if ((ulong)uVar4 < 3) {
              uVar3 = (ulong)uVar4;
            }
            if (uVar4 == 0) {
              uVar3 = 0;
              goto LAB_006933e9;
            }
          }
          uVar5 = 0;
          do {
            pdVar2[uVar5] = local_68 * pdVar1[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
          if ((int)uVar3 == 3) {
            return;
          }
LAB_006933e9:
          do {
            pdVar2[uVar3] = local_68 * pdVar1[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar3 != 3);
          return;
        }
      }
    }
LAB_00693409:
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChElementCableANCF::ComputeNF(const double U,
                                   ChVectorDynamic<>& Qi,
                                   double& detJ,
                                   const ChVectorDynamic<>& F,
                                   ChVectorDynamic<>* state_x,
                                   ChVectorDynamic<>* state_w) {
    ShapeVector N;
    this->ShapeFunctions(N, (U + 1) * 0.5);  // evaluate shape functions (in compressed vector)

    detJ = this->GetRestLength() / 2.0;

    Qi.segment(0, 3) = N(0) * F.segment(0, 3);
    Qi.segment(3, 3) = N(1) * F.segment(0, 3);
    Qi.segment(6, 3) = N(2) * F.segment(0, 3);
    Qi.segment(9, 3) = N(3) * F.segment(0, 3);
}